

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts3SnippetAdvance(char **ppIter,i64 *piIter,int iNext)

{
  long lVar1;
  int in_EDX;
  long *in_RSI;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  i64 iIter;
  char *pIter;
  i64 *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined8 local_18;
  undefined8 local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = (char *)*in_RDI;
  if (local_10 != (char *)0x0) {
    local_18 = *in_RSI;
    while (local_18 < in_EDX) {
      if (((int)*local_10 & 0xfeU) == 0) {
        local_18 = -1;
        local_10 = (char *)0x0;
        break;
      }
      fts3GetDeltaPosition
                ((char **)CONCAT44(in_EDX,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffc8);
    }
    *in_RSI = local_18;
    *in_RDI = local_10;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void fts3SnippetAdvance(char **ppIter, i64 *piIter, int iNext){
  char *pIter = *ppIter;
  if( pIter ){
    i64 iIter = *piIter;

    while( iIter<iNext ){
      if( 0==(*pIter & 0xFE) ){
        iIter = -1;
        pIter = 0;
        break;
      }
      fts3GetDeltaPosition(&pIter, &iIter);
    }

    *piIter = iIter;
    *ppIter = pIter;
  }
}